

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_atomics.cpp
# Opt level: O0

bool anon_unknown.dwarf_22980a5::IsStorageClassAllowedByUniversalRules(StorageClass storage_class)

{
  bool local_9;
  StorageClass storage_class_local;
  
  if ((((storage_class == StorageClassUniform) || (storage_class - StorageClassWorkgroup < 2)) ||
      (storage_class - Function < 2)) ||
     (((storage_class - AtomicCounter < 3 || (storage_class == PhysicalStorageBuffer)) ||
      (storage_class == StorageClassTaskPayloadWorkgroupEXT)))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool IsStorageClassAllowedByUniversalRules(spv::StorageClass storage_class) {
  switch (storage_class) {
    case spv::StorageClass::Uniform:
    case spv::StorageClass::StorageBuffer:
    case spv::StorageClass::Workgroup:
    case spv::StorageClass::CrossWorkgroup:
    case spv::StorageClass::Generic:
    case spv::StorageClass::AtomicCounter:
    case spv::StorageClass::Image:
    case spv::StorageClass::Function:
    case spv::StorageClass::PhysicalStorageBuffer:
    case spv::StorageClass::TaskPayloadWorkgroupEXT:
      return true;
      break;
    default:
      return false;
  }
}